

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lacassagne_2016_code.inc.h
# Opt level: O2

double __thiscall LSL_STD<UF>::Alloc(LSL_STD<UF> *this)

{
  PerformanceEvaluator *perf;
  size_t __n;
  undefined8 uVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  Mat1b *pMVar5;
  Mat1i *pMVar6;
  int *piVar7;
  size_t __n_00;
  ulong uVar8;
  ulong cols;
  size_t rows;
  size_t __n_01;
  int iVar9;
  size_t cols_00;
  size_t __n_02;
  double dVar10;
  Size local_98;
  Mat local_90 [96];
  
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  perf = &(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_;
  dVar10 = UF::Alloc(((*(int *)&pMVar5->field_0x8 + 1) / 2) * ((*(int *)&pMVar5->field_0xc + 1) / 2)
                     + 1,perf);
  PerformanceEvaluator::start(perf);
  uVar1 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_98.height = (int)uVar1;
  local_98.width = (int)((ulong)uVar1 >> 0x20);
  cv::Mat_<int>::Mat_((Mat_<int> *)local_90,&local_98);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar4 = *(int *)&pMVar5->field_0x8;
  rows = (size_t)iVar4;
  cols_00 = (size_t)*(int *)&pMVar5->field_0xc;
  Table2D::Reserve(&this->ER,rows,cols_00);
  cols = cols_00 + 1 & 0xfffffffffffffffe;
  Table2D::Reserve(&this->RLC,rows + 1,cols);
  __n = rows * 4;
  uVar8 = 0xffffffffffffffff;
  if (-1 < (long)rows) {
    uVar8 = __n;
  }
  piVar7 = (int *)operator_new__(uVar8);
  this->ner = piVar7;
  iVar9 = (int)(cols_00 + 1);
  Table2D::Reserve(&this->ERA,rows,(long)iVar9);
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar6->field_0x10,0,*(long *)&pMVar6->field_0x20 - *(long *)&pMVar6->field_0x18
        );
  __n_02 = cols_00 * rows * 4;
  memset(*(this->ER).prows,0,__n_02);
  __n_00 = (long)((int)cols * (int)(rows + 1)) << 2;
  memset(*(this->RLC).prows,0,__n_00);
  memset(this->ner,0,__n);
  __n_01 = (long)(iVar9 * iVar4) << 2;
  memset(*(this->ERA).prows,0,__n_01);
  PerformanceEvaluator::stop(perf);
  dVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  dVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  PerformanceEvaluator::start(perf);
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar6->field_0x10,0,*(long *)&pMVar6->field_0x20 - *(long *)&pMVar6->field_0x18
        );
  memset(*(this->ER).prows,0,__n_02);
  memset(*(this->RLC).prows,0,__n_00);
  memset(this->ner,0,__n);
  memset(*(this->ERA).prows,0,__n_01);
  PerformanceEvaluator::stop(perf);
  return dVar10 + ((dVar2 * 1000.0) / dVar3 -
                  ((this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.
                   last * 1000.0) /
                  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.
                  tick_frequency_);
}

Assistant:

double Alloc()
    {
        // Memory allocation of the labels solver
        double ls_t = LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY, perf_);
        // Memory allocation for the output image and for other structures
        perf_.start();
        img_labels_ = cv::Mat1i(img_.size());

        int rows = img_.rows;
        int cols = img_.cols;

        ER.Reserve(rows, cols); // Matrix of relative label (1 label/pixel)

        // Notes on the RLC table:
        // 1) rows: +1 in order to handle compact usage of RLC table without if statements,
        // 2) columns: MISSING in the paper, RLC requires 2 values/run in row, so width must be next multiple of 2.
        RLC.Reserve(rows + 1, (cols + 1) & ~1);

        ner = new int[rows]; //vector<int> ner(rows); // Number of runs 

        ERA.Reserve(rows, cols + 1); // MISSING in the paper: ERA must have one column more than the input image 
        // in order to handle special cases (e.g. lines with chessboard pattern 
        // starting with a foreground pixel) 

        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(*ER.prows, 0, rows*cols * sizeof(unsigned));
        memset(*RLC.prows, 0, (rows + 1)*((cols + 1) & ~1) * sizeof(unsigned));
        memset(ner, 0, rows*sizeof(int));
        memset(*ERA.prows, 0, rows*(cols + 1) * sizeof(unsigned));
        perf_.stop();
        double t = perf_.last();
        perf_.start();
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(*ER.prows, 0, rows*cols * sizeof(unsigned));
        memset(*RLC.prows, 0, (rows + 1)*((cols + 1) & ~1) * sizeof(unsigned));
        memset(ner, 0, rows*sizeof(int));
        memset(*ERA.prows, 0, rows*(cols + 1) * sizeof(unsigned));
        perf_.stop();
        double ma_t = t - perf_.last();

        // Return total time
        return ls_t + ma_t;
    }